

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

void vkt::anon_unknown_0::getImageUsageFromAttachmentReferences
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *attachmentImageUsage,
               AttachmentRefType refType,size_t count,AttachmentReference *references)

{
  uint *puVar1;
  pointer puVar2;
  size_t sVar3;
  
  puVar2 = (attachmentImageUsage->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (sVar3 = 0; count != sVar3; sVar3 = sVar3 + 1) {
    if ((ulong)references[sVar3].m_attachment != 0xffffffff) {
      puVar1 = puVar2 + references[sVar3].m_attachment;
      *puVar1 = *puVar1 | *(uint *)(&DAT_0095eb20 + (long)(int)refType * 4);
    }
  }
  return;
}

Assistant:

void getImageUsageFromAttachmentReferences(vector<VkImageUsageFlags>& attachmentImageUsage, AttachmentRefType refType, size_t count, const AttachmentReference* references)
{
	for (size_t referenceNdx = 0; referenceNdx < count; ++referenceNdx)
	{
		const deUint32 attachment = references[referenceNdx].getAttachment();

		if (attachment != VK_ATTACHMENT_UNUSED)
		{
			VkImageUsageFlags usage;

			switch (refType)
			{
				case ATTACHMENTREFTYPE_COLOR:
				case ATTACHMENTREFTYPE_RESOLVE:
					usage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
					break;

				case ATTACHMENTREFTYPE_DEPTH_STENCIL:
					usage = VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;
					break;

				case ATTACHMENTREFTYPE_INPUT:
					usage = VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
					break;

				default:
					DE_FATAL("Unexpected attachment reference type");
					usage = 0;
					break;
			}

			attachmentImageUsage[attachment] |= usage;
		}
	}
}